

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nam.cpp
# Opt level: O0

bool mg::data::nam_write(Nam *in,string *out)

{
  size_type sVar1;
  char *pcVar2;
  char *__src;
  char *out_ptr;
  size_type i;
  string *out_local;
  Nam *in_local;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&in->names);
  std::__cxx11::string::resize((ulong)out,((char)sVar1 + '\x01') * ' ');
  out_ptr = (char *)0x0;
  while( true ) {
    pcVar2 = (char *)std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size(&in->names);
    if (pcVar2 <= out_ptr) break;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)out);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&in->names,(size_type)out_ptr);
    __src = (char *)std::__cxx11::string::c_str();
    strncpy(pcVar2,__src,0x20);
    pcVar2[0x1e] = '\r';
    pcVar2[0x1f] = '\n';
    out_ptr = out_ptr + 1;
  }
  return true;
}

Assistant:

bool nam_write(const Nam &in, std::string &out) {
  // Resize output buffer to fit string table + EOF marker
  out.resize((in.names.size() + 1) * Nam::MAX_STRLEN, '\0');

  // Insert each name, truncating if too long
  for (std ::vector<std::string>::size_type i = 0; i < in.names.size(); i++) {
    char *out_ptr = &out[i * Nam::MAX_STRLEN];
    strncpy(out_ptr, in.names[i].c_str(), Nam::MAX_STRLEN);

    // Final 2 bytes must be \r\n
    out_ptr[30] = '\r';
    out_ptr[31] = '\n';
  }

  return true;
}